

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O1

int mqtt_client_connect(MQTT_CLIENT_HANDLE handle,XIO_HANDLE xioHandle,
                       MQTT_CLIENT_OPTIONS *mqttOptions)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  LOGGER_LOG p_Var6;
  char *pcVar7;
  char *local_30;
  
  if (((xioHandle == (XIO_HANDLE)0x0) || (handle == (MQTT_CLIENT_HANDLE)0x0)) ||
     (mqttOptions == (MQTT_CLIENT_OPTIONS *)0x0)) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return 0x450;
    }
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
              ,"mqtt_client_connect",0x44f,1,
              "mqtt_client_connect: NULL argument (handle = %p, mqttOptions = %p, xioHandle: %p)",
              handle,mqttOptions,xioHandle);
    return 0x450;
  }
  handle->xioHandle = xioHandle;
  handle->packetState = UNKNOWN_TYPE;
  handle->qosValue = mqttOptions->qualityOfServiceValue;
  uVar1 = mqttOptions->keepAliveInterval;
  handle->keepAliveInterval = uVar1;
  uVar3 = 0x50;
  if (uVar1 < 0xa2) {
    uVar3 = uVar1 >> 1;
  }
  handle->maxPingRespTime = uVar3;
  handle->timeSincePing = 0;
  iVar5 = 0;
  bVar2 = true;
  if (mqttOptions->clientId != (char *)0x0) {
    iVar4 = mallocAndStrcpy_s(&local_30,mqttOptions->clientId);
    if (iVar4 == 0) {
      pcVar7 = (handle->mqttOptions).clientId;
      if (pcVar7 != (char *)0x0) {
        free(pcVar7);
      }
      (handle->mqttOptions).clientId = local_30;
    }
    else {
      p_Var6 = xlogging_get_log_function();
      iVar5 = 0x222;
      if (p_Var6 == (LOGGER_LOG)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = false;
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"cloneMqttOptions",0x223,1,"mallocAndStrcpy_s clientId");
      }
    }
  }
  if (bVar2) {
    iVar5 = 0;
    if (mqttOptions->willTopic != (char *)0x0) {
      local_30 = (char *)0x0;
      iVar4 = mallocAndStrcpy_s(&local_30,mqttOptions->willTopic);
      if (iVar4 == 0) {
        pcVar7 = (handle->mqttOptions).willTopic;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
        }
        (handle->mqttOptions).willTopic = local_30;
      }
      else {
        p_Var6 = xlogging_get_log_function();
        iVar5 = 0x233;
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                    ,"cloneMqttOptions",0x234,1,"mallocAndStrcpy_s willTopic");
        }
      }
    }
  }
  if (iVar5 == 0) {
    if (mqttOptions->willMessage == (char *)0x0) {
LAB_00163113:
      if (mqttOptions->username != (char *)0x0) {
        local_30 = (char *)0x0;
        iVar5 = mallocAndStrcpy_s(&local_30,mqttOptions->username);
        if (iVar5 != 0) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00162f95;
          pcVar7 = "mallocAndStrcpy_s username";
          iVar5 = 0x255;
          goto LAB_001631d3;
        }
        pcVar7 = (handle->mqttOptions).username;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
        }
        (handle->mqttOptions).username = local_30;
      }
      bVar2 = true;
      if (mqttOptions->password == (char *)0x0) goto LAB_00162f97;
      local_30 = (char *)0x0;
      iVar5 = mallocAndStrcpy_s(&local_30,mqttOptions->password);
      if (iVar5 == 0) {
        pcVar7 = (handle->mqttOptions).password;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
        }
        (handle->mqttOptions).password = local_30;
        bVar2 = true;
        goto LAB_00162f97;
      }
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00162f95;
      pcVar7 = "mallocAndStrcpy_s password";
      iVar5 = 0x266;
    }
    else {
      local_30 = (char *)0x0;
      iVar5 = mallocAndStrcpy_s(&local_30,mqttOptions->willMessage);
      if (iVar5 == 0) {
        pcVar7 = (handle->mqttOptions).willMessage;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
        }
        (handle->mqttOptions).willMessage = local_30;
        goto LAB_00163113;
      }
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_00162f95;
      pcVar7 = "mallocAndStrcpy_s willMessage";
      iVar5 = 0x244;
    }
LAB_001631d3:
    (*p_Var6)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
              ,"cloneMqttOptions",iVar5,1,pcVar7);
    bVar2 = false;
  }
  else {
LAB_00162f95:
    bVar2 = false;
  }
LAB_00162f97:
  if (bVar2) {
    (handle->mqttOptions).keepAliveInterval = mqttOptions->keepAliveInterval;
    (handle->mqttOptions).messageRetain = mqttOptions->messageRetain;
    (handle->mqttOptions).useCleanSession = mqttOptions->useCleanSession;
    (handle->mqttOptions).qualityOfServiceValue = mqttOptions->qualityOfServiceValue;
    iVar5 = xio_open(xioHandle,onOpenComplete,handle,onBytesReceived,handle,onIoError,handle);
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"mqtt_client_connect",0x464,1,"Error: io_open failed");
      }
      handle->xioHandle = (XIO_HANDLE)0x0;
      clear_mqtt_options(handle);
      iVar5 = 0x465;
    }
  }
  else {
    clear_mqtt_options(handle);
    p_Var6 = xlogging_get_log_function();
    iVar5 = 0x45e;
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"mqtt_client_connect",0x45d,1,"Error: Clone Mqtt Options failed");
    }
  }
  return iVar5;
}

Assistant:

int mqtt_client_connect(MQTT_CLIENT_HANDLE handle, XIO_HANDLE xioHandle, MQTT_CLIENT_OPTIONS* mqttOptions)
{
    int result;
    /*SRS_MQTT_CLIENT_07_006: [If any of the parameters handle, ioHandle, or mqttOptions are NULL then mqtt_client_connect shall return a non-zero value.]*/
    if (handle == NULL || mqttOptions == NULL || xioHandle == NULL)
    {
        LogError("mqtt_client_connect: NULL argument (handle = %p, mqttOptions = %p, xioHandle: %p)", handle, mqttOptions, xioHandle);
        result = MU_FAILURE;
    }
    else
    {
        MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
        mqtt_client->xioHandle = xioHandle;
        mqtt_client->packetState = UNKNOWN_TYPE;
        mqtt_client->qosValue = mqttOptions->qualityOfServiceValue;
        mqtt_client->keepAliveInterval = mqttOptions->keepAliveInterval;
        mqtt_client->maxPingRespTime = (DEFAULT_MAX_PING_RESPONSE_TIME < mqttOptions->keepAliveInterval/2) ? DEFAULT_MAX_PING_RESPONSE_TIME : mqttOptions->keepAliveInterval/2;
        mqtt_client->timeSincePing = 0;
        if (cloneMqttOptions(mqtt_client, mqttOptions) != 0)
        {
            LogError("Error: Clone Mqtt Options failed");
            result = MU_FAILURE;
        }
        /*Codes_SRS_MQTT_CLIENT_07_008: [mqtt_client_connect shall open the XIO_HANDLE by calling into the xio_open interface.]*/
        else if (xio_open(xioHandle, onOpenComplete, mqtt_client, onBytesReceived, mqtt_client, onIoError, mqtt_client) != 0)
        {
            /*Codes_SRS_MQTT_CLIENT_07_007: [If any failure is encountered then mqtt_client_connect shall return a non-zero value.]*/
            LogError("Error: io_open failed");
            result = MU_FAILURE;
            mqtt_client->xioHandle = NULL;
            // Remove cloned options
            clear_mqtt_options(mqtt_client);
        }
        else
        {
            result = 0;
        }
    }
    return result;
}